

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_lrzip.c
# Opt level: O0

int lrzip_bidder_init(archive_read_filter *self)

{
  int iVar1;
  long in_RDI;
  int r;
  char *in_stack_00000030;
  archive_read_filter *in_stack_00000038;
  
  iVar1 = __archive_read_program(in_stack_00000038,in_stack_00000030);
  *(undefined4 *)(in_RDI + 0x60) = 10;
  *(char **)(in_RDI + 0x58) = "lrzip";
  return iVar1;
}

Assistant:

static int
lrzip_bidder_init(struct archive_read_filter *self)
{
	int r;

	r = __archive_read_program(self, "lrzip -d -q");
	/* Note: We set the format here even if __archive_read_program()
	 * above fails.  We do, after all, know what the format is
	 * even if we weren't able to read it. */
	self->code = ARCHIVE_FILTER_LRZIP;
	self->name = "lrzip";
	return (r);
}